

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O2

bool __thiscall
Rml::PropertySpecification::ParsePropertyDeclaration
          (PropertySpecification *this,PropertyDictionary *dictionary,String *property_name,
          String *property_value)

{
  PropertyId property_id;
  bool bVar1;
  ShorthandId shorthand_id;
  
  property_id = IdNameMap<Rml::PropertyId>::GetId
                          (&((this->property_map)._M_t.
                             super___uniq_ptr_impl<Rml::PropertyIdNameMap,_std::default_delete<Rml::PropertyIdNameMap>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Rml::PropertyIdNameMap_*,_std::default_delete<Rml::PropertyIdNameMap>_>
                             .super__Head_base<0UL,_Rml::PropertyIdNameMap_*,_false>._M_head_impl)->
                            super_IdNameMap<Rml::PropertyId>,property_name);
  if (property_id != Invalid) {
    bVar1 = ParsePropertyDeclaration(this,dictionary,property_id,property_value);
    return bVar1;
  }
  shorthand_id = IdNameMap<Rml::ShorthandId>::GetId
                           (&((this->shorthand_map)._M_t.
                              super___uniq_ptr_impl<Rml::ShorthandIdNameMap,_std::default_delete<Rml::ShorthandIdNameMap>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Rml::ShorthandIdNameMap_*,_std::default_delete<Rml::ShorthandIdNameMap>_>
                              .super__Head_base<0UL,_Rml::ShorthandIdNameMap_*,_false>._M_head_impl)
                             ->super_IdNameMap<Rml::ShorthandId>,property_name);
  if (shorthand_id != Invalid) {
    bVar1 = ParseShorthandDeclaration(this,dictionary,shorthand_id,property_value);
    return bVar1;
  }
  return false;
}

Assistant:

bool PropertySpecification::ParsePropertyDeclaration(PropertyDictionary& dictionary, const String& property_name, const String& property_value) const
{
	RMLUI_ZoneScoped;

	// Try as a property first
	PropertyId property_id = property_map->GetId(property_name);
	if (property_id != PropertyId::Invalid)
		return ParsePropertyDeclaration(dictionary, property_id, property_value);

	// Then, as a shorthand
	ShorthandId shorthand_id = shorthand_map->GetId(property_name);
	if (shorthand_id != ShorthandId::Invalid)
		return ParseShorthandDeclaration(dictionary, shorthand_id, property_value);

	return false;
}